

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O2

ssize_t __thiscall
fanuc_post_processor::generate_LS::write(generate_LS *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ssize_t sVar2;
  ofstream output_file;
  byte abStack_1f0 [480];
  
  std::ofstream::ofstream(&output_file);
  std::ofstream::open((char *)&output_file,0x106297);
  if ((abStack_1f0[*(long *)(_output_file + -0x18)] & 5) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"cannot open file !!!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::operator<<((ostream *)&output_file,(string *)this);
  std::ofstream::close();
  sVar2 = std::ofstream::~ofstream(&output_file);
  return sVar2;
}

Assistant:

void generate_LS::write() {
        std::ofstream output_file;
        output_file.open("/home/sizen/CLionProjects/generate_LS/pos.ls");
        if(output_file.fail()) std::cout<<"cannot open file !!!"<<std::endl;
        output_file<<program;
        output_file.close();

    }